

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

String __thiscall
testing::internal::XmlUnitTestResultPrinter::EscapeXml
          (XmlUnitTestResultPrinter *this,char *str,bool is_attribute)

{
  byte bVar1;
  XmlUnitTestResultPrinter *pXVar2;
  uint uVar3;
  size_t extraout_RDX;
  char *pcVar4;
  String SVar5;
  String local_50;
  XmlUnitTestResultPrinter *local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Message m;
  
  local_40 = this;
  Message::Message((Message *)&local_38);
  if (str == (char *)0x0) {
LAB_0012940d:
    pXVar2 = local_40;
    StringStreamToString((internal *)local_40,local_38.ptr_);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
    SVar5.length_ = extraout_RDX;
    SVar5.c_str_ = (char *)pXVar2;
    return SVar5;
  }
  do {
    bVar1 = *str;
    if (bVar1 == 0x22) {
      pcVar4 = "&quot;";
      if (is_attribute) {
LAB_001293bd:
        Message::operator<<((Message *)&local_38,(char (*) [7])pcVar4);
      }
      else {
        local_50.c_str_._0_1_ = 0x22;
        Message::operator<<((Message *)&local_38,(char *)&local_50);
      }
    }
    else if (bVar1 == 0x26) {
      Message::operator<<((Message *)&local_38,(char (*) [6])"&amp;");
    }
    else if (bVar1 == 0x27) {
      pcVar4 = "&apos;";
      if (is_attribute) goto LAB_001293bd;
      local_50.c_str_._0_1_ = 0x27;
      Message::operator<<((Message *)&local_38,(char *)&local_50);
    }
    else {
      if (bVar1 == 0x3c) {
        pcVar4 = "&lt;";
      }
      else {
        pcVar4 = "&gt;";
        if (bVar1 != 0x3e) {
          uVar3 = (uint)bVar1;
          if (bVar1 != 0) {
            if (('\x1f' < (char)bVar1) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0))))
            {
              if ((is_attribute) && ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
                String::Format(&local_50,"&#x%02X;");
                Message::operator<<((Message *)&local_38,&local_50);
                String::~String(&local_50);
              }
              else {
                Message::operator<<((Message *)&local_38,str);
              }
            }
            goto LAB_00129405;
          }
          goto LAB_0012940d;
        }
      }
      Message::operator<<((Message *)&local_38,(char (*) [5])pcVar4);
    }
LAB_00129405:
    str = (char *)((byte *)str + 1);
  } while( true );
}

Assistant:

String XmlUnitTestResultPrinter::EscapeXml(const char* str, bool is_attribute) {
  Message m;

  if (str != NULL) {
    for (const char* src = str; *src; ++src) {
      switch (*src) {
        case '<':
          m << "&lt;";
          break;
        case '>':
          m << "&gt;";
          break;
        case '&':
          m << "&amp;";
          break;
        case '\'':
          if (is_attribute)
            m << "&apos;";
          else
            m << '\'';
          break;
        case '"':
          if (is_attribute)
            m << "&quot;";
          else
            m << '"';
          break;
        default:
          if (IsValidXmlCharacter(*src)) {
            if (is_attribute && IsNormalizableWhitespace(*src))
              m << String::Format("&#x%02X;", unsigned(*src));
            else
              m << *src;
          }
          break;
      }
    }
  }

  return m.GetString();
}